

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void __thiscall ImGuiTextIndex::append(ImGuiTextIndex *this,char *base,int old_size,int new_size)

{
  void *pvVar1;
  char *__s;
  int local_3c;
  int *local_38;
  
  if (old_size != new_size) {
    if (((long)this->EndOffset == 0) || (base[(long)this->EndOffset + -1] == '\n')) {
      ImVector<int>::push_back(&this->LineOffsets,&this->EndOffset);
    }
    __s = base + old_size;
    local_38 = &this->EndOffset;
    while( true ) {
      pvVar1 = memchr(__s,10,(long)(base + new_size) - (long)__s);
      if (pvVar1 == (void *)0x0) break;
      __s = (char *)((long)pvVar1 + 1);
      if (__s < base + new_size) {
        local_3c = (int)__s - (int)base;
        ImVector<int>::push_back(&this->LineOffsets,&local_3c);
      }
    }
    if (new_size < *local_38) {
      new_size = *local_38;
    }
    *local_38 = new_size;
  }
  return;
}

Assistant:

void ImGuiTextIndex::append(const char* base, int old_size, int new_size)
{
    IM_ASSERT(old_size >= 0 && new_size >= old_size && new_size >= EndOffset);
    if (old_size == new_size)
        return;
    if (EndOffset == 0 || base[EndOffset - 1] == '\n')
        LineOffsets.push_back(EndOffset);
    const char* base_end = base + new_size;
    for (const char* p = base + old_size; (p = (const char*)memchr(p, '\n', base_end - p)) != 0; )
        if (++p < base_end) // Don't push a trailing offset on last \n
            LineOffsets.push_back((int)(intptr_t)(p - base));
    EndOffset = ImMax(EndOffset, new_size);
}